

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessControlOutputVerticesCase::iterate
          (TessControlOutputVerticesCase *this)

{
  Context *pCVar1;
  RenderContext *renderCtx;
  TestLog *log;
  undefined8 uVar2;
  ContextInfo *pCVar3;
  int iVar4;
  Context *pCVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *in_RCX;
  char *globalLayouts;
  char *globalLayouts_00;
  long lVar6;
  size_type __dnew;
  size_type __dnew_1;
  ResultCollector result;
  ShaderProgram program;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  Context *local_348;
  ContextInfo *local_340;
  undefined1 local_338 [24];
  value_type local_320;
  Context *local_300;
  ContextInfo *local_2f8;
  Context local_2f0;
  value_type local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  uint local_1f8;
  value_type local_1f0;
  undefined1 local_1d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  renderCtx = pCVar1->m_renderCtx;
  memset(local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  local_338._16_8_ = (ContextInfo *)0x75;
  local_300 = &local_2f0;
  pCVar5 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_300,(ulong)(local_338 + 0x10))
  ;
  uVar2 = local_338._16_8_;
  local_2f0.m_testCtx = (TestContext *)local_338._16_8_;
  local_300 = pCVar5;
  memcpy(pCVar5,
         "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(float(gl_VertexID), float(gl_VertexID / 2), 0.0, 1.0);\n}\n"
         ,0x75);
  local_2f8 = (ContextInfo *)uVar2;
  *(undefined1 *)((long)(Platform **)uVar2 + (long)&pCVar5->m_testCtx) = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)pCVar1->m_renderCtx,local_300,in_RCX);
  local_370._0_8_ = (ulong)(uint)local_370._4_4_ << 0x20;
  local_370._8_8_ = local_360._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_370 + 8),local_258._M_dataplus._M_p,
             local_258._M_dataplus._M_p + local_258._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (local_370._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_370 + 8));
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  local_348 = (Context *)local_338;
  local_2f0.m_contextInfo = (ContextInfo *)0x7f;
  pCVar5 = (Context *)
           std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)&local_2f0.m_contextInfo);
  pCVar3 = local_2f0.m_contextInfo;
  local_338._0_8_ = local_2f0.m_contextInfo;
  local_348 = pCVar5;
  memcpy(pCVar5,
         "${GLSL_VERSION_DECL}\nlayout (location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
         ,0x7f);
  local_340 = pCVar3;
  *(undefined1 *)((long)&pCVar3->_vptr_ContextInfo + (long)&pCVar5->m_testCtx) = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_278,(_anonymous_namespace_ *)pCVar1->m_renderCtx,local_348,in_RCX);
  local_338._16_4_ = 1;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,local_278._M_dataplus._M_p,
             local_278._M_dataplus._M_p + local_278._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (local_338._16_8_ & 0xffffffff) * 0x18),&local_320);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  (anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
            ((string *)local_218,"layout(vertices=4) out",globalLayouts);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_298,(_anonymous_namespace_ *)pCVar1->m_renderCtx,(Context *)local_218._0_8_,
             in_RCX);
  local_2f0.m_contextInfo = (ContextInfo *)CONCAT44(local_2f0.m_contextInfo._4_4_,3);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_298._M_dataplus._M_p,
             local_298._M_dataplus._M_p + local_298._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + ((ulong)local_2f0.m_contextInfo & 0xffffffff) * 0x18),&local_2d8);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  (anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
            ((string *)local_238,"layout(triangles) in",globalLayouts_00);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2b8,(_anonymous_namespace_ *)pCVar1->m_renderCtx,(Context *)local_238._0_8_,
             in_RCX);
  local_1f8 = 4;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (ulong)local_1f8 * 0x18),&local_1f0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((Context *)local_238._0_8_ != (Context *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((Context *)local_218._0_8_ != (Context *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (Context *)local_338) {
    operator_delete(local_348,(ulong)((long)(_func_int ***)local_338._0_8_ + 1));
  }
  if ((char *)local_370._8_8_ != local_360._M_local_buf + 8) {
    operator_delete((void *)local_370._8_8_,local_360._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,(ulong)((long)&(local_2f0.m_testCtx)->m_platform + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::operator<<(((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log,&local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    iVar4 = (*((this->super_TessProgramQueryCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              ((CallLogWrapper *)(local_338 + 0x10),(Functions *)CONCAT44(extraout_var,iVar4),
               ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log);
    log = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
          )->m_log;
    local_370._0_8_ = &local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370," // ERROR: ","");
    tcu::ResultCollector::ResultCollector((ResultCollector *)local_1d0,log,(string *)local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
    }
    local_320._M_string_length._0_1_ = 1;
    gls::StateQueryUtil::verifyStateProgramInteger
              ((ResultCollector *)local_1d0,(CallLogWrapper *)(local_338 + 0x10),
               local_100.m_program.m_program,0x8e75,4,QUERY_PROGRAM_INTEGER);
    tcu::ResultCollector::setTestContextResult
              ((ResultCollector *)local_1d0,
               (this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != local_190) {
      operator_delete(local_1a0._M_p,(ulong)(local_190[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._8_8_ != &local_1b8) {
      operator_delete((void *)local_1d0._8_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)(local_338 + 0x10));
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"failed to build program","");
  tcu::TestError::TestError(this_00,(string *)local_1d0);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TessControlOutputVerticesCase::IterateResult TessControlOutputVerticesCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=4) out").c_str()))
																<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource("layout(triangles) in").c_str())));

	m_testCtx.getLog() << program;
	if (!program.isOk())
		throw tcu::TestError("failed to build program");

	{
		glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
		tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

		gl.enableLogging(true);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 4, QUERY_PROGRAM_INTEGER);

		result.setTestContextResult(m_testCtx);
	}
	return STOP;
}